

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O1

Float AdaptiveSimpson(function<float_(float)> *f,Float x0,Float x1,Float eps,int depth)

{
  undefined1 auVar1 [16];
  undefined8 *puVar2;
  float fVar3;
  int count;
  function<float_(float,_float,_float,_float,_float,_float,_float,_float,_int)> integrate;
  Float local_64;
  Float local_60;
  float local_5c;
  float local_58;
  float local_54;
  Float local_50;
  undefined4 local_4c;
  function<float_(float,_float,_float,_float,_float,_float,_float,_float,_int)> local_48;
  
  local_4c = 0;
  local_48 = (function<float_(float,_float,_float,_float,_float,_float,_float,_float,_int)>)
             ZEXT1232(ZEXT812(0));
  local_60 = x1;
  local_50 = eps;
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = f;
  puVar2[1] = &local_4c;
  puVar2[2] = &local_48;
  local_48.super__Function_base._M_functor._M_unused._M_object = puVar2;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<float_(float,_float,_float,_float,_float,_float,_float,_float,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bsdfs_test.cpp:146:21)>
       ::_M_manager;
  local_48._M_invoker =
       std::
       _Function_handler<float_(float,_float,_float,_float,_float,_float,_float,_float,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bsdfs_test.cpp:146:21)>
       ::_M_invoke;
  local_64 = x0;
  if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  local_54 = (*f->_M_invoker)((_Any_data *)f,&local_64);
  local_64 = (x0 + local_60) * 0.5;
  local_58 = local_64;
  if ((f->super__Function_base)._M_manager != (_Manager_type)0x0) {
    local_5c = (*f->_M_invoker)((_Any_data *)f,&local_64);
    local_64 = local_60;
    if ((f->super__Function_base)._M_manager != (_Manager_type)0x0) {
      fVar3 = (*f->_M_invoker)((_Any_data *)f,&local_64);
      auVar1 = vfmadd231ss_fma(ZEXT416((uint)local_54),ZEXT416((uint)local_5c),ZEXT416(0x40800000));
      fVar3 = std::function<float_(float,_float,_float,_float,_float,_float,_float,_float,_int)>::
              operator()(&local_48,x0,local_58,local_60,local_54,local_5c,fVar3,
                         (local_60 - x0) * 0.16666667 * (auVar1._0_4_ + fVar3),local_50,depth);
      if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_48.super__Function_base._M_manager)
                  ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
      }
      return fVar3;
    }
    std::__throw_bad_function_call();
  }
  std::__throw_bad_function_call();
}

Assistant:

Float AdaptiveSimpson(const std::function<Float(Float)>& f, Float x0, Float x1,
                      Float eps = 1e-6f, int depth = 6) {
    int count = 0;
    /* Define an recursive lambda function for integration over subintervals */
    std::function<Float(Float, Float, Float, Float, Float, Float, Float, Float, int)>
        integrate = [&](Float a, Float b, Float c, Float fa, Float fb, Float fc, Float I,
                        Float eps, int depth) {
            /* Evaluate the function at two intermediate points */
            Float d = 0.5f * (a + b), e = 0.5f * (b + c), fd = f(d), fe = f(e);

            /* Simpson integration over each subinterval */
            Float h = c - a, I0 = (Float)(1.0 / 12.0) * h * (fa + 4 * fd + fb),
                  I1 = (Float)(1.0 / 12.0) * h * (fb + 4 * fe + fc), Ip = I0 + I1;
            ++count;

            /* Stopping criterion from J.N. Lyness (1969)
              "Notes on the adaptive Simpson quadrature routine" */
            if (depth <= 0 || std::abs(Ip - I) < 15 * eps) {
                // Richardson extrapolation
                return Ip + (Float)(1.0 / 15.0) * (Ip - I);
            }

            return integrate(a, d, b, fa, fd, fb, I0, .5f * eps, depth - 1) +
                   integrate(b, e, c, fb, fe, fc, I1, .5f * eps, depth - 1);
        };
    Float a = x0, b = 0.5f * (x0 + x1), c = x1;
    Float fa = f(a), fb = f(b), fc = f(c);
    Float I = (c - a) * (Float)(1.0 / 6.0) * (fa + 4 * fb + fc);
    return integrate(a, b, c, fa, fb, fc, I, eps, depth);
}